

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_equation.hpp
# Opt level: O0

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_>
                    *param_2)

{
  ostream *poVar1;
  ct_variable<1UL> local_1a;
  ct_variable<0UL> local_19;
  ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_> *local_18;
  ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_> *param_1_local;
  ostream *stream_local;
  
  local_18 = param_2;
  param_1_local = (ct_equation<viennamath::ct_variable<0UL>,_viennamath::ct_variable<1UL>_> *)stream
  ;
  poVar1 = std::operator<<(stream,"ct_equation(");
  ct_variable<0UL>::ct_variable(&local_19);
  poVar1 = operator<<(poVar1,&local_19);
  poVar1 = std::operator<<(poVar1," = ");
  ct_variable<1UL>::ct_variable(&local_1a);
  poVar1 = operator<<(poVar1,&local_1a);
  std::operator<<(poVar1,")");
  return (ostream *)param_1_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_equation<LHS, RHS> const & /*u*/)
  {
    stream << "ct_equation(" << LHS() << " = " << RHS() << ")";
    return stream;
  }